

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::checkHasValue(DataDictionary *this,FieldBase *field)

{
  int field_00;
  long lVar1;
  NoTagValue *this_00;
  allocator<char> local_39;
  string local_38;
  FieldBase *local_18;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  if ((this->m_checkFieldsHaveValues & 1U) != 0) {
    local_18 = field;
    field_local = (FieldBase *)this;
    FieldBase::getString_abi_cxx11_(field);
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      this_00 = (NoTagValue *)__cxa_allocate_exception(0x58);
      field_00 = FieldBase::getTag(local_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      NoTagValue::NoTagValue(this_00,field_00,&local_38);
      __cxa_throw(this_00,&NoTagValue::typeinfo,NoTagValue::~NoTagValue);
    }
  }
  return;
}

Assistant:

EXCEPT(NoTagValue) {
    if (m_checkFieldsHaveValues && !field.getString().length()) {
      throw NoTagValue(field.getTag());
    }
  }